

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void __thiscall Pubkey_CombineTest_Test::TestBody(Pubkey_CombineTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_588;
  Message local_580;
  string local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_7;
  Message local_540;
  string local_538;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_6;
  Message local_500;
  string local_4f8;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_5;
  Message local_4c0;
  string local_4b8;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_4;
  Pubkey pk_c14;
  Pubkey pk_c13;
  Pubkey pk_c12;
  Pubkey pk_c11;
  undefined1 local_420 [8];
  string exp_pk_c2p;
  undefined1 local_3f8 [8];
  string exp_pk_c2;
  undefined1 local_3d0 [8];
  string exp_pk_cp;
  string local_3a8;
  undefined1 local_388 [8];
  Pubkey pk_b2;
  string local_368;
  undefined1 local_348 [8];
  Pubkey pk_b1;
  string local_328;
  undefined1 local_308 [8];
  Pubkey pk_a2;
  string local_2e8;
  undefined1 local_2c8 [8];
  Pubkey pk_a1;
  Message local_2a8;
  string local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_3;
  Message local_268;
  string local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  Message local_1e8;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  Pubkey pk_c3;
  Privkey sk_c;
  undefined1 local_160 [8];
  Pubkey pk_c2;
  Pubkey pk_c1;
  Pubkey pk_b;
  Pubkey pk_a;
  undefined1 local_f8 [8];
  string exp_pk_c;
  undefined1 local_d0 [8];
  string exp_sk_c;
  string local_a8;
  undefined1 local_88 [8];
  Privkey sk_b;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey sk_a;
  Pubkey_CombineTest_Test *this_local;
  
  sk_a._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)(exp_sk_c.field_2._M_local_buf + 0xf));
  cfd::core::Privkey::Privkey((Privkey *)local_88,&local_a8,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_c.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d0,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d",
             (allocator *)(exp_pk_c.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_c.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_f8,"03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71"
             ,(allocator *)
              ((long)&pk_a.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_a.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GetPubkey
            ((Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30);
  cfd::core::Privkey::GetPubkey
            ((Pubkey *)
             &pk_c1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_88);
  cfd::core::operator+
            ((Pubkey *)
             &pk_c2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Pubkey *)
             &pk_c1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)local_160,
             (Pubkey *)
             &pk_c1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::operator+=
            ((Pubkey *)&sk_c.is_compressed_,(Pubkey *)local_160,
             (Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&sk_c.is_compressed_);
  cfd::core::operator+
            ((Privkey *)
             &pk_c3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30,
             (Privkey *)local_88);
  cfd::core::Privkey::GetPubkey
            ((Pubkey *)&gtest_ar.message_,
             (Privkey *)
             &pk_c3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_1e0,
             (Pubkey *)
             &pk_c2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"exp_pk_c","pk_c1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_220,(Pubkey *)local_160);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_200,"exp_pk_c","pk_c2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             &local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_260,(Pubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_240,"exp_pk_c","pk_c3.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             &local_260);
  std::__cxx11::string::~string((string *)&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  cfd::core::Privkey::GetHex_abi_cxx11_
            (&local_2a0,
             (Privkey *)
             &pk_c3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_280,"exp_sk_c","sk_c.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             &local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &pk_a1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2e8,
             "024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&pk_a2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_2c8,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_a2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_328,
             "034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)
             ((long)&pk_b1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_308,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_b1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_368,
             "02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)
             ((long)&pk_b2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_348,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_b2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a8,
             "03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)(exp_pk_cp.field_2._M_local_buf + 0xf));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_388,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_cp.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_3d0,
             "02c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71",
             (allocator *)(exp_pk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_3f8,
             "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)(exp_pk_c2p.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_pk_c2p.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_420,
             "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)
             ((long)&pk_c11.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_c11.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::operator+
            ((Pubkey *)
             &pk_c12.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_2c8,
             (Pubkey *)local_348);
  cfd::core::operator+
            ((Pubkey *)
             &pk_c13.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_308,
             (Pubkey *)local_348);
  cfd::core::operator+
            ((Pubkey *)
             &pk_c14.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_2c8,
             (Pubkey *)local_388);
  cfd::core::operator+((Pubkey *)&gtest_ar_4.message_,(Pubkey *)local_308,(Pubkey *)local_388);
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_4b8,
             (Pubkey *)
             &pk_c12.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_498,"exp_pk_cp","pk_c11.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,
             &local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_4f8,
             (Pubkey *)
             &pk_c13.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4d8,"exp_pk_c2","pk_c12.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
             &local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_538,
             (Pubkey *)
             &pk_c14.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_518,"exp_pk_c2p","pk_c13.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
             &local_538);
  std::__cxx11::string::~string((string *)&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_578,(Pubkey *)&gtest_ar_4.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_558,"exp_pk_c","pk_c14.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             &local_578);
  std::__cxx11::string::~string((string *)&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_4.message_);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_c14.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_c13.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_c12.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_420);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3d0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_388);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_348);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_308);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_2c8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar.message_);
  cfd::core::Privkey::~Privkey
            ((Privkey *)
             &pk_c3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_160);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_c2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_c1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_d0);
  cfd::core::Privkey::~Privkey((Privkey *)local_88);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(Pubkey, CombineTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  std::string exp_sk_c = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_pk_c = "03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";

  auto pk_a = sk_a.GetPubkey();
  auto pk_b = sk_b.GetPubkey();

  auto pk_c1 = pk_a + pk_b;
  Pubkey pk_c2 = pk_b;
  pk_c2 += pk_a;

  auto sk_c = sk_a + sk_b;
  auto pk_c3 = sk_c.GetPubkey();

  EXPECT_EQ(exp_pk_c, pk_c1.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c2.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c3.GetHex());
  EXPECT_EQ(exp_sk_c, sk_c.GetHex());

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_cp = "02c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  auto pk_c11 = pk_a1 + pk_b1;
  auto pk_c12 = pk_a2 + pk_b1;
  auto pk_c13 = pk_a1 + pk_b2;
  auto pk_c14 = pk_a2 + pk_b2;

  EXPECT_EQ(exp_pk_cp, pk_c11.GetHex());
  EXPECT_EQ(exp_pk_c2, pk_c12.GetHex());
  EXPECT_EQ(exp_pk_c2p, pk_c13.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c14.GetHex());
}